

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O1

void __thiscall duckdb::RleBpEncoder::WriteCurrentBlockRLE(RleBpEncoder *this,WriteStream *writer)

{
  bool bVar1;
  _func_int **pp_Var2;
  InternalException *this_00;
  undefined8 uVar3;
  ulong uVar4;
  string local_50;
  
  uVar4 = this->rle_count * 2;
  do {
    local_50._M_dataplus._M_p._0_1_ = (0x7f < uVar4) << 7 | (byte)uVar4 & 0x7f;
    (**writer->_vptr_WriteStream)(writer,&local_50,1);
    bVar1 = 0x7f < uVar4;
    uVar4 = uVar4 >> 7;
  } while (bVar1);
  switch(this->byte_width) {
  case 1:
    local_50._M_dataplus._M_p._0_1_ = (char)this->rle_value;
    pp_Var2 = writer->_vptr_WriteStream;
    break;
  case 2:
    local_50._M_dataplus._M_p._0_2_ = (short)this->rle_value;
    pp_Var2 = writer->_vptr_WriteStream;
    uVar3 = 2;
    goto LAB_01d0b851;
  case 3:
    local_50._M_dataplus._M_p._0_1_ = (byte)this->rle_value;
    (**writer->_vptr_WriteStream)(writer,&local_50,1);
    local_50._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)&this->rle_value + 1);
    (**writer->_vptr_WriteStream)(writer,&local_50,1);
    local_50._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)&this->rle_value + 2);
    pp_Var2 = writer->_vptr_WriteStream;
    break;
  case 4:
    local_50._M_dataplus._M_p._0_4_ = this->rle_value;
    pp_Var2 = writer->_vptr_WriteStream;
    uVar3 = 4;
    goto LAB_01d0b851;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"unsupported byte width for RLE encoding","");
    InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar3 = 1;
LAB_01d0b851:
  (**pp_Var2)(writer,&local_50,uVar3);
  this->rle_count = 0;
  return;
}

Assistant:

void WriteCurrentBlockRLE(WriteStream &writer) {
		ParquetDecodeUtils::VarintEncode(rle_count << 1 | 0, writer); // (... | 0) signals RLE run
		D_ASSERT(rle_value >> (byte_width * 8) == 0);
		switch (byte_width) {
		case 1:
			writer.Write<uint8_t>(rle_value);
			break;
		case 2:
			writer.Write<uint16_t>(rle_value);
			break;
		case 3:
			writer.Write<uint8_t>(rle_value & 0xFF);
			writer.Write<uint8_t>((rle_value >> 8) & 0xFF);
			writer.Write<uint8_t>((rle_value >> 16) & 0xFF);
			break;
		case 4:
			writer.Write<uint32_t>(rle_value);
			break;
		default:
			throw InternalException("unsupported byte width for RLE encoding");
		}
		rle_count = 0;
	}